

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O0

KDataStream * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::Encode(KDataStream *__return_storage_ptr__,LE_EulerAngles *this)

{
  LE_EulerAngles *this_local;
  KDataStream *stream;
  
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Encode(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream LE_EulerAngles::Encode() const
{
    KDataStream stream;

    LE_EulerAngles::Encode( stream );

    return stream;
}